

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_UploadMultipleBlocksToBlob
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *destinationFileName,
          IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK getDataCallback,void *context)

{
  IOTHUB_CLIENT_RESULT IVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  UPLOAD_MULTIPLE_BLOCKS_WRAPPER_CONTEXT uploadMultipleBlocksWrapperContext;
  LOGGER_LOG l_2;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext;
  _Bool uploadSucceeded;
  LOGGER_LOG l_1;
  char *azureBlobSasUri;
  char *uploadCorrelationId;
  LOGGER_LOG l;
  IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK p_Stack_30;
  IOTHUB_CLIENT_RESULT result;
  void *context_local;
  IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK getDataCallback_local;
  char *destinationFileName_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  p_Stack_30 = (IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK)context;
  context_local = getDataCallback;
  getDataCallback_local = (IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK)destinationFileName;
  destinationFileName_local = (char *)iotHubClientHandle;
  if (((iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) ||
      (destinationFileName == (char *)0x0)) ||
     (getDataCallback == (IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK)0x0)) {
    uploadCorrelationId = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)uploadCorrelationId != (LOGGER_LOG)0x0) {
      (*(code *)uploadCorrelationId)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                 ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlob",0xb19,1,
                 "invalid parameters IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle=%p, const char* destinationFileName=%p, getDataCallback=%p"
                 ,destinationFileName_local,getDataCallback_local,context_local);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    IVar1 = IoTHubClient_LL_UploadToBlob_InitializeUpload
                      (iotHubClientHandle->uploadToBlobHandle,destinationFileName,&azureBlobSasUri,
                       (char **)&l_1);
    if (IVar1 == IOTHUB_CLIENT_OK) {
      azureStorageClientHandle =
           IoTHubClient_LL_UploadToBlob_CreateContext
                     (*(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE *)(destinationFileName_local + 0x198),
                      (char *)l_1);
      if (azureStorageClientHandle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) {
        uploadMultipleBlocksWrapperContext.context = xlogging_get_log_function();
        if ((LOGGER_LOG)uploadMultipleBlocksWrapperContext.context != (LOGGER_LOG)0x0) {
          (*(code *)uploadMultipleBlocksWrapperContext.context)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                     ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlob",0xb2e,1,
                     "Failed creating upload to blob context");
        }
      }
      else {
        l_3 = (LOGGER_LOG)context_local;
        uploadMultipleBlocksWrapperContext.getDataCallback = p_Stack_30;
        IVar1 = IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks
                          (azureStorageClientHandle,uploadMultipleBlocksCallbackWrapper,&l_3);
        if ((IVar1 != IOTHUB_CLIENT_OK) &&
           (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlob",0xb3a,1,
                    "Failed to upload multiple blocks to Azure blob");
        }
        IoTHubClient_LL_UploadToBlob_DestroyContext(azureStorageClientHandle);
      }
      IVar1 = IoTHubClient_LL_UploadToBlob_NotifyCompletion
                        (*(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE *)
                          (destinationFileName_local + 0x198),azureBlobSasUri,false,400,(char *)0x0)
      ;
      if ((IVar1 != IOTHUB_CLIENT_OK) &&
         (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlob",0xb49,1,
                  "Failed completing upload to blob.");
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
      free(azureBlobSasUri);
      free(l_1);
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlob",0xb24,1,
                  "Failed initializing upload in IoT Hub");
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_UploadMultipleBlocksToBlob(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* destinationFileName, IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK getDataCallback, void* context)
{
    IOTHUB_CLIENT_RESULT result;
    if (
        (iotHubClientHandle == NULL) ||
        (destinationFileName == NULL) ||
        (getDataCallback == NULL)
        )
    {
        LogError("invalid parameters IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle=%p, const char* destinationFileName=%p, getDataCallback=%p", iotHubClientHandle, destinationFileName, getDataCallback);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        char* uploadCorrelationId;
        char* azureBlobSasUri;

        if (IoTHubClient_LL_UploadToBlob_InitializeUpload(
                iotHubClientHandle->uploadToBlobHandle, destinationFileName, &uploadCorrelationId, &azureBlobSasUri) != IOTHUB_CLIENT_OK)
        {
            LogError("Failed initializing upload in IoT Hub");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            bool uploadSucceeded;
            IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext = IoTHubClient_LL_UploadToBlob_CreateContext(iotHubClientHandle->uploadToBlobHandle, azureBlobSasUri);

            if (uploadContext == NULL)
            {
                LogError("Failed creating upload to blob context");
                uploadSucceeded = false;
            }
            else
            {
                UPLOAD_MULTIPLE_BLOCKS_WRAPPER_CONTEXT uploadMultipleBlocksWrapperContext;
                uploadMultipleBlocksWrapperContext.getDataCallback = getDataCallback;
                uploadMultipleBlocksWrapperContext.context = context;

                if (IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks(
                        uploadContext, uploadMultipleBlocksCallbackWrapper, &uploadMultipleBlocksWrapperContext) != IOTHUB_CLIENT_OK)
                {
                    LogError("Failed to upload multiple blocks to Azure blob");
                    uploadSucceeded = false;
                }
                else
                {
                    uploadSucceeded = false;
                }

                IoTHubClient_LL_UploadToBlob_DestroyContext(uploadContext);
            }

            // TODO (ewertons): fix the http error status below.
            if (IoTHubClient_LL_UploadToBlob_NotifyCompletion(
                    iotHubClientHandle->uploadToBlobHandle, uploadCorrelationId, uploadSucceeded, 400, NULL) != IOTHUB_CLIENT_OK)
            {
                LogError("Failed completing upload to blob.");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = (uploadSucceeded ? IOTHUB_CLIENT_OK : IOTHUB_CLIENT_ERROR); 
            }

            free(uploadCorrelationId);
            free(azureBlobSasUri);
        }
    }
    
    return result;
}